

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

string * nonius::detail::percentage_abi_cxx11_(double d)

{
  _Setprecision _Var1;
  ostream *poVar2;
  string *in_RDI;
  double in_XMM0_Qa;
  ostringstream ss;
  undefined8 in_stack_fffffffffffffe38;
  ios_base *in_stack_fffffffffffffe40;
  ostringstream local_188 [376];
  double local_10;
  
  local_10 = in_XMM0_Qa;
  std::__cxx11::ostringstream::ostringstream(local_188);
  _Var1 = std::setprecision(3);
  std::operator<<((ostream *)local_188,_Var1);
  if (((local_10 == 0.0) && (!NAN(local_10))) || (1e-05 <= local_10)) {
    std::ios_base::unsetf
              (in_stack_fffffffffffffe40,(fmtflags)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    poVar2 = (ostream *)std::ostream::operator<<(local_188,local_10 * 100.0);
    std::operator<<(poVar2,"%");
  }
  else {
    std::ostream::operator<<(local_188,std::fixed);
    poVar2 = (ostream *)std::ostream::operator<<(local_188,0.0001);
    std::operator<<(poVar2,"%");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

inline std::string percentage(double d) {
            std::ostringstream ss;
            ss << std::setprecision(3);
            if(d != 0 && d < 1e-5) {
                ss << std::fixed;
                ss << 0.0001 << "%";
            } else {
                ss.unsetf(std::ios::floatfield);
                ss << (100. * d) << "%";
            }
            return ss.str();
        }